

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O3

Vec4 __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::getSurfaceThreshold
          (TriangleDerivateCaseInstance *this)

{
  undefined1 auVar1 [16];
  int in_ESI;
  ulong in_XMM1_Qa;
  Vec4 VVar2;
  
  if (in_ESI != 0) {
    (this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance = (_func_int **)0x0
    ;
    (this->super_ShaderRenderCaseInstance).super_TestInstance.m_context = (Context *)0x0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_XMM1_Qa;
    return (float  [4])(auVar1 << 0x40);
  }
  (this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)0x3b8080813b808081;
  (this->super_ShaderRenderCaseInstance).super_TestInstance.m_context =
       (Context *)0x3b8080813b808081;
  VVar2.m_data._8_8_ = in_XMM1_Qa;
  VVar2.m_data[0] = 0.003921569;
  VVar2.m_data[1] = 0.003921569;
  return (Vec4)VVar2.m_data;
}

Assistant:

tcu::Vec4 TriangleDerivateCaseInstance::getSurfaceThreshold (void) const
{
	switch (m_definitions.surfaceType)
	{
		case SURFACETYPE_UNORM_FBO:				return tcu::IVec4(1).asFloat() / 255.0f;
		case SURFACETYPE_FLOAT_FBO:				return tcu::Vec4(0.0f);
		default:
			DE_ASSERT(false);
			return tcu::Vec4(0.0f);
	}
}